

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H23_linked_list.c
# Opt level: O0

CELL * insert(CELL *x,int val)

{
  CELL *pCVar1;
  CELL *p;
  int val_local;
  CELL *x_local;
  
  pCVar1 = (CELL *)malloc(0x10);
  pCVar1->value = val;
  pCVar1->next = x->next;
  x->next = pCVar1;
  return pCVar1;
}

Assistant:

struct CELL *insert(struct CELL *x, int val) {
  struct CELL *p;
  p = (struct CELL *)malloc(sizeof(struct CELL));

  p->value = val;
  p->next = x->next;
  x->next = p;

  return p;
}